

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2C02.h
# Opt level: O2

Sprite * __thiscall m2C02::GetPatternTable(m2C02 *this,uint8_t i,uint8_t palette)

{
  ushort addr;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  Sprite *this_00;
  anon_union_4_2_12391da5_for_Pixel_0 *paVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  undefined7 in_register_00000031;
  uint uVar10;
  
  this_00 = (this->sprPatternTable)._M_elems + (CONCAT71(in_register_00000031,i) & 0xffffffff);
  for (iVar4 = 0; iVar4 != 0x10; iVar4 = iVar4 + 1) {
    iVar8 = 0;
    for (iVar5 = 0; iVar5 != 0x10; iVar5 = iVar5 + 1) {
      for (uVar10 = 0; uVar10 != 8; uVar10 = uVar10 + 1) {
        addr = (ushort)uVar10 |
               (ushort)(iVar5 << 4) | (ushort)(iVar4 << 8) |
               (ushort)(((uint)CONCAT71(in_register_00000031,i) & 0xf) << 0xc);
        bVar1 = ppuRead(this,addr,false);
        bVar2 = ppuRead(this,addr | 8,false);
        for (iVar9 = 7; iVar9 != -1; iVar9 = iVar9 + -1) {
          bVar3 = bVar1 & 1;
          bVar7 = bVar2 & 1;
          bVar1 = bVar1 >> 1;
          bVar2 = bVar2 >> 1;
          paVar6 = &GetColourFromPaletteRam(this,palette,bVar7 + bVar3)->field_0;
          olc::Sprite::SetPixel(this_00,iVar8 + iVar9,uVar10 | iVar4 * 8,(Pixel)paVar6->field_1);
        }
      }
      iVar8 = iVar8 + 8;
    }
  }
  return this_00;
}

Assistant:

olc::Sprite &GetPatternTable(uint8_t i, uint8_t palette)
  {
    for (uint16_t nTileY = 0; nTileY < 16; nTileY++)
    {
      for (uint16_t nTileX = 0; nTileX < 16; nTileX++)
      {
        uint16_t nOffset = nTileY * 256 + nTileX * 16;

        for (uint16_t row = 0; row < 8; row++)
        {
          uint8_t tileLsb = ppuRead(i * 0x1000u + nOffset + row + 0);
          uint8_t tileMsb = ppuRead(i * 0x1000u + nOffset + row + 8);

          for (uint16_t col = 0; col < 8; col++)
          {
            uint8_t pixel = (tileLsb & 0x01u) + (tileMsb & 0x01u);
            tileLsb >>= 1;
            tileMsb >>= 1;
            sprPatternTable[i].SetPixel(
                nTileX * 8 + (7 - col), nTileY * 8 + row,
                GetColourFromPaletteRam(palette, pixel));
          }
        }
      }
    }

    return sprPatternTable[i];
  }